

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

GPU_Image * GPU_LoadImage_RW(SDL_RWops *rwops,_Bool free_rwops)

{
  SDL_Surface *pSVar1;
  GPU_Image *pGVar2;
  
  if ((_gpu_current_renderer != (GPU_Renderer *)0x0) &&
     (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0)) {
    pSVar1 = GPU_LoadSurface_RW(rwops,free_rwops);
    if (pSVar1 != (SDL_Surface *)0x0) {
      pGVar2 = (*_gpu_current_renderer->impl->CopyImageFromSurface)(_gpu_current_renderer,pSVar1);
      SDL_FreeSurface(pSVar1);
      return pGVar2;
    }
    GPU_PushErrorCode("GPU_LoadImage_RW",GPU_ERROR_DATA_ERROR,"Failed to load image data.");
  }
  return (GPU_Image *)0x0;
}

Assistant:

GPU_Image* GPU_LoadImage_RW(SDL_RWops* rwops, GPU_bool free_rwops)
{
	GPU_Image* result;
	SDL_Surface* surface;
    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL)
        return NULL;
        
    surface = GPU_LoadSurface_RW(rwops, free_rwops);
    if(surface == NULL)
    {
        GPU_PushErrorCode("GPU_LoadImage_RW", GPU_ERROR_DATA_ERROR, "Failed to load image data.");
        return NULL;
    }

    result = _gpu_current_renderer->impl->CopyImageFromSurface(_gpu_current_renderer, surface);
    SDL_FreeSurface(surface);

    return result;
}